

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::BaseRAPass::_dumpBlockLiveness(BaseRAPass *this,String *sb,RABlock *block)

{
  VirtReg *pVVar1;
  RAWorkReg *pRVar2;
  bool bVar3;
  RAWorkReg **ppRVar4;
  RALiveSpan<asmjit::LiveRegData> *args;
  long lVar5;
  RAWorkReg *unaff_RBX;
  BaseRAPass *this_00;
  char *pcVar6;
  char *str;
  uint32_t workId;
  uint32_t index;
  ulong unaff_R12;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  ulong unaff_R15;
  float fStack_b8;
  float fStack_b4;
  uint32_t uStack_b0;
  uint32_t uStack_ac;
  ulong uStack_a8;
  RAWorkRegs *pRStack_a0;
  ulong uStack_98;
  size_t sStack_90;
  RAWorkReg *pRStack_88;
  ulong uStack_80;
  ulong uStack_78;
  String *pSStack_70;
  ulong uStack_68;
  long lStack_60;
  BaseRAPass *local_50;
  ZoneBitVector *local_48;
  long local_40;
  char *bitsName;
  
  local_48 = block->_liveBits;
  lVar5 = 0;
  local_50 = this;
  while( true ) {
    if (lVar5 == 4) {
      return 0;
    }
    bitsName = "KILL";
    if (lVar5 == 2) {
      bitsName = "GEN ";
    }
    if (lVar5 == 1) {
      bitsName = "OUT ";
    }
    pcVar6 = "IN  ";
    if (lVar5 == 0) {
      bitsName = "IN  ";
    }
    uVar9 = local_48[lVar5]._size;
    if ((local_50->_workRegs).super_ZoneVectorBase._size < uVar9) break;
    this_00 = (BaseRAPass *)(local_48 + lVar5);
    unaff_R15 = 0;
    unaff_R12 = 0;
    local_40 = lVar5;
    while( true ) {
      index = (uint32_t)unaff_R12;
      iVar8 = (int)unaff_R15;
      if (uVar9 == index) break;
      lStack_60 = 0x1200b9;
      this = this_00;
      bVar3 = ZoneBitVector::bitAt((ZoneBitVector *)this_00,index);
      if (bVar3) {
        lStack_60 = 0x1200ca;
        unaff_RBX = workRegById(local_50,index);
        if (iVar8 == 0) {
          lStack_60 = 0x1200f7;
          String::appendFormat<char_const*&>(sb,"    %s [",&bitsName);
        }
        else {
          lStack_60 = 0x1200e4;
          String::append(sb,", ",0xffffffffffffffff);
        }
        pVVar1 = unaff_RBX->_virtReg;
        if (*(uint *)&(pVVar1->_name).field_0 < 0xc) {
          pcVar6 = (pVVar1->_name).field_0._wholeData + 4;
        }
        else {
          pcVar6 = *(char **)((long)&(pVVar1->_name).field_0 + 8);
        }
        lStack_60 = 0x120116;
        this = (BaseRAPass *)sb;
        String::append(sb,pcVar6,0xffffffffffffffff);
        unaff_R15 = (ulong)(iVar8 + 1);
      }
      unaff_R12 = (ulong)(index + 1);
    }
    if (iVar8 != 0) {
      lStack_60 = 0x120135;
      this = (BaseRAPass *)sb;
      String::append(sb,"]\n",0xffffffffffffffff);
    }
    lVar5 = local_40 + 1;
  }
  lStack_60 = 0x12015d;
  _dumpBlockLiveness();
  pRStack_a0 = &this->_workRegs;
  uStack_98 = (ulong)(this->_workRegs).super_ZoneVectorBase._size;
  uStack_a8 = (ulong)this->_maxWorkRegNameSize;
  pRStack_88 = unaff_RBX;
  uStack_80 = unaff_R12;
  uStack_78 = (ulong)uVar9;
  pSStack_70 = sb;
  uStack_68 = unaff_R15;
  lStack_60 = lVar5 * 0x10;
  for (sStack_90 = 0; sStack_90 != uStack_98; sStack_90 = sStack_90 + 1) {
    ppRVar4 = ZoneVector<asmjit::RAWorkReg_*>::operator[](pRStack_a0,sStack_90);
    pRVar2 = *ppRVar4;
    String::append((String *)pcVar6,"  ",0xffffffffffffffff);
    sVar7 = (size_t)(((String *)pcVar6)->field_0)._type;
    if (0x1e < sVar7) {
      sVar7 = (((String *)pcVar6)->field_0)._large.size;
    }
    pVVar1 = pRVar2->_virtReg;
    if (*(uint *)&(pVVar1->_name).field_0 < 0xc) {
      str = (pVVar1->_name).field_0._wholeData + 4;
    }
    else {
      str = *(char **)((long)&(pVVar1->_name).field_0 + 8);
    }
    String::append((String *)pcVar6,str,0xffffffffffffffff);
    String::padEnd((String *)pcVar6,sVar7 + uStack_a8,' ');
    uStack_ac = pRVar2->_virtId;
    uStack_b0 = (pRVar2->_liveStats)._width;
    fStack_b4 = (pRVar2->_liveStats)._freq;
    fStack_b8 = (pRVar2->_liveStats)._priority;
    String::appendFormat<unsigned_int,unsigned_int,float,float>
              ((String *)pcVar6," {id:%04u width: %-4u freq: %0.4f priority=%0.4f}",&uStack_ac,
               &uStack_b0,&fStack_b4,&fStack_b8);
    String::append((String *)pcVar6,": ",0xffffffffffffffff);
    for (uVar9 = 0; uVar9 < (pRVar2->_liveSpans)._data.super_ZoneVectorBase._size; uVar9 = uVar9 + 1
        ) {
      args = RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_>::operator[]
                       (&pRVar2->_liveSpans,uVar9);
      if (uVar9 != 0) {
        String::append((String *)pcVar6,", ",0xffffffffffffffff);
      }
      String::appendFormat<unsigned_int_const&,unsigned_int_const&>
                ((String *)pcVar6,"[%u:%u]",(uint *)args,&(args->super_RALiveInterval).b);
    }
    String::append((String *)pcVar6,'\n');
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseRAPass::_dumpBlockLiveness(String& sb, const RABlock* block) noexcept {
  for (uint32_t liveType = 0; liveType < RABlock::kLiveCount; liveType++) {
    const char* bitsName = liveType == RABlock::kLiveIn  ? "IN  " :
                           liveType == RABlock::kLiveOut ? "OUT " :
                           liveType == RABlock::kLiveGen ? "GEN " : "KILL";

    const ZoneBitVector& bits = block->_liveBits[liveType];
    uint32_t size = bits.size();
    ASMJIT_ASSERT(size <= workRegCount());

    uint32_t n = 0;
    for (uint32_t workId = 0; workId < size; workId++) {
      if (bits.bitAt(workId)) {
        RAWorkReg* wReg = workRegById(workId);

        if (!n)
          sb.appendFormat("    %s [", bitsName);
        else
          sb.append(", ");

        sb.append(wReg->name());
        n++;
      }
    }

    if (n)
      sb.append("]\n");
  }

  return kErrorOk;
}